

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

void __thiscall
capnp::compiler::Declaration::Builder::adoptNakedAnnotation
          (Builder *this,Orphan<capnp::compiler::Declaration::AnnotationApplication> *value)

{
  PointerBuilder builder;
  uint uVar1;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *value_00;
  PointerBuilder local_30;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *local_18;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *value_local;
  Builder *this_local;
  
  local_18 = value;
  value_local = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)this;
  uVar1 = bounded<1u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Declaration::Which>
            (&this->_builder,uVar1,NAKED_ANNOTATION);
  uVar1 = bounded<5u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  value_00 = kj::mv<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>(local_18);
  builder.capTable = local_30.capTable;
  builder.segment = local_30.segment;
  builder.pointer = local_30.pointer;
  capnp::_::PointerHelpers<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::
  adopt(builder,value_00);
  return;
}

Assistant:

inline void Declaration::Builder::adoptNakedAnnotation(
    ::capnp::Orphan< ::capnp::compiler::Declaration::AnnotationApplication>&& value) {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::NAKED_ANNOTATION);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Declaration::AnnotationApplication>::adopt(_builder.getPointerField(
      ::capnp::bounded<5>() * ::capnp::POINTERS), kj::mv(value));
}